

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.c
# Opt level: O2

int linenoiseHistoryAdd(char *line)

{
  char **__dest;
  int iVar1;
  char *pcVar2;
  uint uVar3;
  
  if ((((history != (char **)0x0) ||
       (history = (char **)calloc(1,(ulong)(uint)history_max_len << 3), history != (char **)0x0)) &&
      (((long)history_len == 0 || (iVar1 = strcmp(history[(long)history_len + -1],line), iVar1 != 0)
       ))) && (pcVar2 = _strdup(line), iVar1 = history_len, __dest = history, pcVar2 != (char *)0x0)
     ) {
    uVar3 = history_len;
    if (history_len == history_max_len) {
      free(*history);
      uVar3 = iVar1 - 1;
      memmove(__dest,__dest + 1,(ulong)uVar3 * 8);
    }
    __dest[(int)uVar3] = pcVar2;
    history_len = uVar3 + 1;
    return 1;
  }
  return 0;
}

Assistant:

int linenoiseHistoryAdd(const char *line) {
    char *linecopy;

    if (history_max_len == 0) return 0;

    /* Initialization on first call. */
    if (history == NULL) {
        history = malloc(sizeof(char*)*history_max_len);
        if (history == NULL) return 0;
        memset(history,0,(sizeof(char*)*history_max_len));
    }

    /* Don't add duplicated lines. */
    if (history_len && !strcmp(history[history_len-1], line)) return 0;

    /* Add an heap allocated copy of the line in the history.
     * If we reached the max length, remove the older line. */
    linecopy = _strdup(line);
    if (!linecopy) return 0;
    if (history_len == history_max_len) {
        free(history[0]);
        memmove(history,history+1,sizeof(char*)*(history_max_len-1));
        history_len--;
    }
    history[history_len] = linecopy;
    history_len++;
    return 1;
}